

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O1

void __thiscall
tcu::TestException::TestException
          (TestException *this,char *message,char *expr,char *file,int line,qpTestResult result)

{
  undefined4 in_register_00000084;
  string local_38;
  
  formatError_abi_cxx11_
            (&local_38,(tcu *)message,expr,file,(char *)CONCAT44(in_register_00000084,line),result);
  Exception::Exception(&this->super_Exception,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_Exception = &PTR__Exception_00d5b770;
  this->m_result = result;
  return;
}

Assistant:

TestException::TestException (const char* message, const char* expr, const char* file, int line, qpTestResult result)
	: Exception	(formatError(message, expr, file, line))
	, m_result	(result)
{
}